

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

MipLevelProperties *
Diligent::GetMipLevelProperties
          (MipLevelProperties *__return_storage_ptr__,TextureDesc *TexDesc,Uint32 MipLevel)

{
  Uint32 UVar1;
  type_conflict tVar2;
  uint *puVar3;
  Char *pCVar4;
  char (*Args_1) [56];
  MipLevelProperties *MipProps;
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  TextureFormatAttribs *local_20;
  TextureFormatAttribs *FmtAttribs;
  TextureDesc *pTStack_10;
  Uint32 MipLevel_local;
  TextureDesc *TexDesc_local;
  
  FmtAttribs._4_4_ = MipLevel;
  pTStack_10 = TexDesc;
  MipLevelProperties::MipLevelProperties(__return_storage_ptr__);
  local_20 = GetTextureFormatAttribs(pTStack_10->Format);
  UVar1 = TextureDesc::GetWidth(pTStack_10);
  local_24 = UVar1 >> ((byte)FmtAttribs._4_4_ & 0x1f);
  local_28 = 1;
  puVar3 = std::max<unsigned_int>(&local_24,&local_28);
  __return_storage_ptr__->LogicalWidth = *puVar3;
  UVar1 = TextureDesc::GetHeight(pTStack_10);
  local_2c = UVar1 >> ((byte)FmtAttribs._4_4_ & 0x1f);
  local_30 = 1;
  puVar3 = std::max<unsigned_int>(&stack0xffffffffffffffd4,&stack0xffffffffffffffd0);
  __return_storage_ptr__->LogicalHeight = *puVar3;
  UVar1 = TextureDesc::GetDepth(pTStack_10);
  Args_1 = (char (*) [56])(ulong)FmtAttribs._4_4_;
  msg.field_2._12_4_ = UVar1 >> ((byte)FmtAttribs._4_4_ & 0x1f);
  msg.field_2._8_4_ = 1;
  puVar3 = std::max<unsigned_int>
                     ((uint *)(msg.field_2._M_local_buf + 0xc),
                      (uint *)(msg.field_2._M_local_buf + 8));
  __return_storage_ptr__->Depth = *puVar3;
  if (local_20->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    if ((local_20->BlockWidth < 2) || (local_20->BlockHeight < 2)) {
      FormatString<char[26],char[56]>
                ((string *)local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1",Args_1);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x814);
      std::__cxx11::string::~string((string *)local_58);
    }
    if ((local_20->BlockWidth & local_20->BlockWidth - 1) != 0) {
      FormatString<char[52]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [52])"Compressed block width is expected to be power of 2");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x815);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((local_20->BlockHeight & local_20->BlockHeight - 1) != 0) {
      FormatString<char[53]>
                ((string *)&MipProps,
                 (char (*) [53])"Compressed block height is expected to be power of 2");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x816);
      std::__cxx11::string::~string((string *)&MipProps);
    }
    tVar2 = AlignUp<unsigned_int,unsigned_int>
                      (__return_storage_ptr__->LogicalWidth,(uint)local_20->BlockWidth);
    __return_storage_ptr__->StorageWidth = tVar2;
    tVar2 = AlignUp<unsigned_int,unsigned_int>
                      (__return_storage_ptr__->LogicalHeight,(uint)local_20->BlockHeight);
    __return_storage_ptr__->StorageHeight = tVar2;
    __return_storage_ptr__->RowSize =
         ((ulong)__return_storage_ptr__->StorageWidth / (ulong)local_20->BlockWidth) *
         (ulong)local_20->ComponentSize;
    __return_storage_ptr__->DepthSliceSize =
         ((ulong)__return_storage_ptr__->StorageHeight / (ulong)local_20->BlockHeight) *
         __return_storage_ptr__->RowSize;
    __return_storage_ptr__->MipSize =
         __return_storage_ptr__->DepthSliceSize * (ulong)__return_storage_ptr__->Depth;
  }
  else {
    __return_storage_ptr__->StorageWidth = __return_storage_ptr__->LogicalWidth;
    __return_storage_ptr__->StorageHeight = __return_storage_ptr__->LogicalHeight;
    __return_storage_ptr__->RowSize =
         (ulong)__return_storage_ptr__->StorageWidth * (ulong)local_20->ComponentSize *
         (ulong)local_20->NumComponents;
    __return_storage_ptr__->DepthSliceSize =
         __return_storage_ptr__->RowSize * (ulong)__return_storage_ptr__->StorageHeight;
    __return_storage_ptr__->MipSize =
         __return_storage_ptr__->DepthSliceSize * (ulong)__return_storage_ptr__->Depth;
  }
  return __return_storage_ptr__;
}

Assistant:

MipLevelProperties GetMipLevelProperties(const TextureDesc& TexDesc, Uint32 MipLevel)
{
    MipLevelProperties          MipProps;
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    MipProps.LogicalWidth  = std::max(TexDesc.GetWidth() >> MipLevel, 1u);
    MipProps.LogicalHeight = std::max(TexDesc.GetHeight() >> MipLevel, 1u);
    MipProps.Depth         = std::max(TexDesc.GetDepth() >> MipLevel, 1u);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        VERIFY_EXPR(FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1);
        VERIFY((FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0, "Compressed block width is expected to be power of 2");
        VERIFY((FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0, "Compressed block height is expected to be power of 2");
        // For block-compression formats, all parameters are still specified in texels rather than compressed texel blocks (18.4.1)
        MipProps.StorageWidth   = AlignUp(MipProps.LogicalWidth, Uint32{FmtAttribs.BlockWidth});
        MipProps.StorageHeight  = AlignUp(MipProps.LogicalHeight, Uint32{FmtAttribs.BlockHeight});
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} / Uint32{FmtAttribs.BlockWidth} * Uint32{FmtAttribs.ComponentSize}; // ComponentSize is the block size
        MipProps.DepthSliceSize = MipProps.StorageHeight / Uint32{FmtAttribs.BlockHeight} * MipProps.RowSize;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }
    else
    {
        MipProps.StorageWidth   = MipProps.LogicalWidth;
        MipProps.StorageHeight  = MipProps.LogicalHeight;
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} * Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
        MipProps.DepthSliceSize = MipProps.RowSize * MipProps.StorageHeight;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }

    return MipProps;
}